

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

SpecifierSyntax * __thiscall
psy::C::List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>::
lastValue(List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
          *this)

{
  List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_> *local_20
  ;
  SyntaxNodePlainList<psy::C::SpecifierSyntax_*> *it;
  SpecifierSyntax *v;
  List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
  *this_local;
  
  it = (SyntaxNodePlainList<psy::C::SpecifierSyntax_*> *)0x0;
  for (local_20 = this;
      local_20 !=
      (List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_> *)
      0x0; local_20 = (List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                       *)local_20->next) {
    if (local_20->value != (SpecifierSyntax *)0x0) {
      it = (SyntaxNodePlainList<psy::C::SpecifierSyntax_*> *)local_20->value;
    }
  }
  return (SpecifierSyntax *)it;
}

Assistant:

ValueT lastValue() const
    {
        ValueT v = nullptr;
        for (auto it = const_cast<DerivedListT*>(static_cast<const DerivedListT*>(this));
                it;
                it = it->next) {
            if (it->value)
                v = it->value;
        }
        return v;
    }